

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O0

void __thiscall fasttext::QMatrix::QMatrix(QMatrix *this,Matrix *mat,int32_t dsub,bool qnorm)

{
  int64_t iVar1;
  ProductQuantizer *__new_size;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_> *this_00;
  byte in_CL;
  int in_EDX;
  Matrix *in_RDI;
  QMatrix *unaff_retaddr;
  pointer in_stack_ffffffffffffff68;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  *in_stack_ffffffffffffff70;
  Matrix *in_stack_ffffffffffffff78;
  Matrix *this_01;
  Matrix *this_02;
  pointer *ppuVar2;
  ProductQuantizer *this_03;
  Matrix *matrix;
  
  this_02 = in_RDI;
  matrix = in_RDI;
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>(in_stack_ffffffffffffff70);
  ppuVar2 = &(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&in_RDI->data_)->
             _M_impl).super__Vector_impl_data._M_finish;
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>(in_stack_ffffffffffffff70);
  this_03 = (ProductQuantizer *)
            &(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&in_RDI->data_)->
             _M_impl).super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1820a9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1820bc);
  *(byte *)&in_RDI[1].m_ = in_CL & 1;
  iVar1 = Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  in_RDI[1].n_ = iVar1;
  this_01 = this_02 + 2;
  __new_size = (ProductQuantizer *)
               Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  ((_Head_base<0UL,_fasttext::ProductQuantizer_*,_false> *)
  &(this_01->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
   super__Vector_impl_data._M_start)->_M_head_impl = __new_size;
  *(int *)&this_02[2].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish =
       (int)this_02[1].n_ *
       (int)((long)((long)this_02[2].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start + (long)in_EDX + -1) / (long)in_EDX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02,(size_type)__new_size)
  ;
  operator_new(0x50);
  ProductQuantizer::ProductQuantizer(this_03,(int32_t)((ulong)ppuVar2 >> 0x20),(int32_t)ppuVar2);
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator=(in_stack_ffffffffffffff70,
            (unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             *)in_stack_ffffffffffffff68);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  ~unique_ptr((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               *)this_01);
  if ((this_02[1].m_ & 1) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02,
               (size_type)__new_size);
    this_00 = (unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               *)operator_new(0x50);
    ProductQuantizer::ProductQuantizer(this_03,(int32_t)((ulong)ppuVar2 >> 0x20),(int32_t)ppuVar2);
    std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
    unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>
              (this_00,in_stack_ffffffffffffff68);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator=(this_00,(unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                       *)in_stack_ffffffffffffff68);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    ~unique_ptr((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                 *)this_01);
  }
  quantize(unaff_retaddr,matrix);
  return;
}

Assistant:

QMatrix::QMatrix(const Matrix& mat, int32_t dsub, bool qnorm)
    : qnorm_(qnorm),
      m_(mat.size(0)),
      n_(mat.size(1)),
      codesize_(m_ * ((n_ + dsub - 1) / dsub)) {
  codes_.resize(codesize_);
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(n_, dsub));
  if (qnorm_) {
    norm_codes_.resize(m_);
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(1, 1));
  }
  quantize(mat);
}